

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZAnalyticSolution.cpp
# Opt level: O3

void __thiscall
TStokesAnalytic::uxy<Fad<double>>
          (TStokesAnalytic *this,TPZVec<Fad<double>_> *x,TPZVec<Fad<double>_> *flux)

{
  uint uVar1;
  undefined1 *puVar2;
  undefined1 auVar3 [16];
  TPZVec<Fad<double>_> *pTVar4;
  int iVar5;
  double *pdVar6;
  ulong uVar7;
  long lVar8;
  Fad<double> *pFVar9;
  uint uVar10;
  Fad<double> *pFVar11;
  ulong uVar12;
  undefined1 auVar13 [16];
  double dVar14;
  long lVar16;
  undefined1 auVar15 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  Fad<double> x1;
  Fad<double> x2;
  Fad<double> x3;
  undefined1 auStack_2f8 [16];
  Fad<double> *local_2e8;
  Fad<double> *pFStack_2e0;
  Fad<double> *local_2d8;
  TPZVec<Fad<double>_> *local_2d0;
  undefined1 local_2c8 [16];
  Fad<double> *pFStack_2b8;
  FadExpr<FadFuncCos<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_> *pFStack_2b0;
  Fad<double> *local_2a8;
  undefined1 local_2a0 [24];
  Fad<double> *pFStack_288;
  undefined1 local_278 [16];
  Fad<double> *local_268;
  double *pdStack_260;
  Fad<double> *local_258;
  undefined1 local_250 [24];
  Fad<double> *pFStack_238;
  Fad<double> *local_228;
  undefined8 uStack_220;
  undefined1 local_218 [16];
  MEM_CPY<double> *local_208;
  Fad<double> *local_200;
  Fad<double> local_1f8;
  undefined1 local_1d8 [24];
  FadExpr<FadFuncSin<Fad<double>_>_> *local_1c0;
  undefined1 local_1b0 [24];
  FadExpr<FadFuncSin<Fad<double>_>_> *local_198;
  Fad<double> *local_188;
  undefined8 uStack_180;
  undefined1 local_170 [40];
  uint local_148;
  MEM_CPY<double> *local_140;
  double local_138;
  FadExpr<FadFuncSin<Fad<double>_>_> local_130;
  Fad<double> *local_108;
  undefined8 uStack_100;
  FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadFuncSin<Fad<double>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>_>_>_>_>
  *local_f0;
  Fad<double> *local_e8;
  Vector<double> local_e0;
  FadExpr<FadFuncCos<Fad<double>_>_> *local_d0;
  FadExpr<FadFuncCos<Fad<double>_>_> *local_c8;
  FadExpr<FadFuncCos<Fad<double>_>_> **local_c0;
  Fad<double> *local_b8;
  FadExpr<FadFuncCos<Fad<double>_>_> **local_b0;
  undefined1 *local_a8;
  FadExpr<FadFuncSin<Fad<double>_>_> *local_a0;
  FadExpr<FadFuncSin<Fad<double>_>_> *local_98;
  FadExpr<FadFuncCos<Fad<double>_>_> ***local_90;
  FadExpr<FadFuncSin<Fad<double>_>_> **local_88;
  FadExpr<FadFuncCos<Fad<double>_>_> *local_80;
  Fad<double> *local_78;
  undefined8 local_70;
  FadExpr<FadFuncCos<Fad<double>_>_> ****local_68;
  FadExpr<FadFuncSin<Fad<double>_>_> *local_60;
  FadExpr<FadFuncSin<Fad<double>_>_> *local_58;
  FadExpr<FadFuncCos<Fad<double>_>_> ***local_50;
  FadExpr<FadFuncSin<Fad<double>_>_> **local_48;
  FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadFuncSin<Fad<double>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadFuncSin<Fad<double>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>_>_>_>_>_>_>
  local_40;
  
  pFVar11 = x->fStore;
  local_218._0_8_ = pFVar11->val_;
  uVar1 = (pFVar11->dx_).num_elts;
  local_208 = (MEM_CPY<double> *)0x0;
  pFVar9 = pFVar11;
  local_2d0 = flux;
  local_218._8_4_ = uVar1;
  local_188 = (Fad<double> *)local_218._0_8_;
  if ((long)(int)uVar1 != 0) {
    uVar12 = 0xffffffffffffffff;
    if (-1 < (int)uVar1) {
      uVar12 = (long)(int)uVar1 << 3;
    }
    local_208 = (MEM_CPY<double> *)operator_new__(uVar12);
    MEM_CPY<double>::copy
              (local_208,(EVP_PKEY_CTX *)(pFVar11->dx_).ptr_to_data,(EVP_PKEY_CTX *)(ulong)uVar1);
    pFVar9 = x->fStore;
  }
  local_228 = (Fad<double> *)pFVar11->defaultVal;
  local_1f8.val_ = pFVar9[1].val_;
  uVar10 = pFVar9[1].dx_.num_elts;
  local_1f8.dx_.ptr_to_data = (double *)0x0;
  pFVar11 = pFVar9;
  local_200 = local_228;
  local_1f8.dx_.num_elts = uVar10;
  local_108 = (Fad<double> *)local_1f8.val_;
  if ((long)(int)uVar10 != 0) {
    uVar12 = 0xffffffffffffffff;
    if (-1 < (int)uVar10) {
      uVar12 = (long)(int)uVar10 * 8;
    }
    local_1f8.dx_.ptr_to_data = (double *)operator_new__(uVar12);
    MEM_CPY<double>::copy
              ((MEM_CPY<double> *)local_1f8.dx_.ptr_to_data,
               (EVP_PKEY_CTX *)pFVar9[1].dx_.ptr_to_data,(EVP_PKEY_CTX *)(ulong)uVar10);
    pFVar11 = x->fStore;
  }
  local_1f8.defaultVal = pFVar9[1].defaultVal;
  local_170._32_8_ = pFVar11[2].val_;
  uVar10 = pFVar11[2].dx_.num_elts;
  local_140 = (MEM_CPY<double> *)0x0;
  local_148 = uVar10;
  if ((long)(int)uVar10 != 0) {
    uVar12 = 0xffffffffffffffff;
    if (-1 < (int)uVar10) {
      uVar12 = (long)(int)uVar10 * 8;
    }
    local_140 = (MEM_CPY<double> *)operator_new__(uVar12);
    MEM_CPY<double>::copy
              (local_140,(EVP_PKEY_CTX *)pFVar11[2].dx_.ptr_to_data,(EVP_PKEY_CTX *)(ulong)uVar10);
  }
  pTVar4 = local_2d0;
  local_138 = pFVar11[2].defaultVal;
  switch(this->fExactSol) {
  case EKovasznay:
  case EKovasznayCDG:
    dVar14 = 1.0 / this->fvisco;
    local_228 = (Fad<double> *)(dVar14 * 0.5);
    dVar14 = this->Pi * 4.0 * this->Pi + dVar14 * dVar14 * 0.25;
    if (dVar14 < 0.0) {
      dVar14 = sqrt(dVar14);
    }
    else {
      dVar14 = SQRT(dVar14);
    }
    pTVar4 = local_2d0;
    local_268 = (Fad<double> *)((double)local_228 - dVar14);
    pdStack_260 = (double *)0x0;
    local_258 = (Fad<double> *)local_218;
    local_2e8 = (Fad<double> *)(this->Pi + this->Pi);
    pFStack_2e0 = (Fad<double> *)0x0;
    pFStack_2b0 = (FadExpr<FadFuncCos<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_> *)
                  local_2a0;
    local_2c8._8_8_ = 1.0;
    pFStack_2b8 = (Fad<double> *)0x0;
    local_2d8 = &local_1f8;
    local_2a0._0_8_ =
         (FadExpr<FadFuncCos<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_> *)local_278;
    local_2a0._8_8_ = (FadExpr<FadFuncSin<Fad<double>_>_> *)auStack_2f8;
    local_228 = local_268;
    Fad<double>::operator=
              (local_2d0->fStore,
               (FadExpr<FadBinaryMinus<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadFuncExp<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>_>_>
                *)local_2c8);
    local_2e8 = (Fad<double> *)(this->Pi + this->Pi);
    local_268 = local_228;
    local_2c8._8_8_ = (double)local_228 / (double)local_2e8;
    pdStack_260 = (double *)0x0;
    local_258 = (Fad<double> *)local_218;
    pFStack_2b8 = (Fad<double> *)0x0;
    pFStack_2e0 = (Fad<double> *)0x0;
    local_2d8 = &local_1f8;
    pFStack_2b0 = (FadExpr<FadFuncCos<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_> *)
                  local_278;
    local_2a0._0_8_ = (Fad<double> *)local_2c8;
    local_2a0._8_8_ = (FadExpr<FadFuncSin<Fad<double>_>_> *)auStack_2f8;
    Fad<double>::operator=
              (pTVar4->fStore + 1,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncExp<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>
                *)local_2a0);
    break;
  case ESinCos:
    FadFuncSin<Fad<double>_>::FadFuncSin
              ((FadFuncSin<Fad<double>_> *)auStack_2f8,(Fad<double> *)local_218);
    FadExpr<FadFuncSin<Fad<double>_>_>::FadExpr
              ((FadExpr<FadFuncSin<Fad<double>_>_> *)local_278,
               (FadFuncSin<Fad<double>_> *)auStack_2f8);
    Fad<double>::~Fad((Fad<double> *)auStack_2f8);
    local_2a0._8_8_ = (FadExpr<FadFuncSin<Fad<double>_>_> *)0xbff0000000000000;
    local_2a0._16_8_ = (double *)0x0;
    pFStack_288 = (Fad<double> *)local_278;
    FadFuncSin<Fad<double>_>::FadFuncSin((FadFuncSin<Fad<double>_> *)local_2c8,&local_1f8);
    pTVar4 = local_2d0;
    FadExpr<FadFuncSin<Fad<double>_>_>::FadExpr
              ((FadExpr<FadFuncSin<Fad<double>_>_> *)auStack_2f8,
               (FadFuncSin<Fad<double>_> *)local_2c8);
    Fad<double>::~Fad((Fad<double> *)local_2c8);
    local_250._0_8_ = (FadExpr<FadFuncCos<Fad<double>_>_> *)local_2a0;
    local_250._8_8_ = (FadExpr<FadFuncSin<Fad<double>_>_> *)auStack_2f8;
    Fad<double>::operator=
              (pTVar4->fStore,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>
                *)local_250);
    Fad<double>::~Fad((Fad<double> *)(auStack_2f8 + 8));
    Fad<double>::~Fad((Fad<double> *)(local_278 + 8));
    FadFuncCos<Fad<double>_>::FadFuncCos
              ((FadFuncCos<Fad<double>_> *)auStack_2f8,(Fad<double> *)local_218);
    FadExpr<FadFuncCos<Fad<double>_>_>::FadExpr
              ((FadExpr<FadFuncCos<Fad<double>_>_> *)local_278,
               (FadFuncCos<Fad<double>_> *)auStack_2f8);
    Fad<double>::~Fad((Fad<double> *)auStack_2f8);
    local_2a0._8_8_ = (FadExpr<FadFuncSin<Fad<double>_>_> *)0xbff0000000000000;
    local_2a0._16_8_ = (double *)0x0;
    pFStack_288 = (Fad<double> *)local_278;
    FadFuncCos<Fad<double>_>::FadFuncCos((FadFuncCos<Fad<double>_> *)local_2c8,&local_1f8);
    FadExpr<FadFuncCos<Fad<double>_>_>::FadExpr
              ((FadExpr<FadFuncCos<Fad<double>_>_> *)auStack_2f8,
               (FadFuncCos<Fad<double>_> *)local_2c8);
    Fad<double>::~Fad((Fad<double> *)local_2c8);
    local_250._0_8_ = (FadExpr<FadFuncCos<Fad<double>_>_> *)local_2a0;
    local_250._8_8_ = (Fad<double> *)auStack_2f8;
    Fad<double>::operator=
              (pTVar4->fStore + 1,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>
                *)local_250);
    goto LAB_013ef573;
  case ENoFlow:
    uVar12 = (ulong)uVar1;
    pFVar11 = local_2d0->fStore;
    uVar10 = (pFVar11->dx_).num_elts;
    if (uVar1 == uVar10) {
      if (uVar1 == 0) goto LAB_013efc61;
      pdVar6 = (pFVar11->dx_).ptr_to_data;
      uVar10 = uVar1;
LAB_013ef8bf:
      if (0 < (int)uVar1) {
        uVar7 = 0;
        do {
          pdVar6[uVar7] = *(double *)(local_208 + uVar7 * 8) * 0.0;
          uVar7 = uVar7 + 1;
        } while (uVar12 != uVar7);
        local_188 = (Fad<double> *)local_218._0_8_;
      }
    }
    else {
      if (uVar1 == 0) {
        if (uVar10 != 0) {
          pdVar6 = (pFVar11->dx_).ptr_to_data;
          if (pdVar6 != (double *)0x0) {
            operator_delete__(pdVar6);
          }
          (pFVar11->dx_).num_elts = 0;
          (pFVar11->dx_).ptr_to_data = (double *)0x0;
          uVar10 = local_218._8_4_;
          goto LAB_013efc63;
        }
      }
      else {
        if (uVar10 != 0) {
          pdVar6 = (pFVar11->dx_).ptr_to_data;
          if (pdVar6 != (double *)0x0) {
            operator_delete__(pdVar6);
          }
          (pFVar11->dx_).ptr_to_data = (double *)0x0;
        }
        (pFVar11->dx_).num_elts = uVar1;
        uVar7 = 0xffffffffffffffff;
        if (-1 < (int)uVar1) {
          uVar7 = uVar12 * 8;
        }
        pdVar6 = (double *)operator_new__(uVar7);
        (pFVar11->dx_).ptr_to_data = pdVar6;
        auVar3 = _DAT_014d28c0;
        uVar10 = local_218._8_4_;
        if (local_218._8_4_ != 0) goto LAB_013ef8bf;
        if (0 < (int)uVar1) {
          local_228 = (Fad<double> *)((double)local_228 * 0.0);
          lVar8 = uVar12 - 1;
          auVar13._8_4_ = (int)lVar8;
          auVar13._0_8_ = lVar8;
          auVar13._12_4_ = (int)((ulong)lVar8 >> 0x20);
          lVar8 = 0;
          auVar13 = auVar13 ^ _DAT_014d28c0;
          auVar18 = _DAT_014d28b0;
          do {
            auVar17 = auVar18 ^ auVar3;
            if ((bool)(~(auVar17._4_4_ == auVar13._4_4_ && auVar13._0_4_ < auVar17._0_4_ ||
                        auVar13._4_4_ < auVar17._4_4_) & 1)) {
              *(Fad<double> **)((long)pdVar6 + lVar8) = local_228;
            }
            if ((auVar17._12_4_ != auVar13._12_4_ || auVar17._8_4_ <= auVar13._8_4_) &&
                auVar17._12_4_ <= auVar13._12_4_) {
              *(Fad<double> **)((long)pdVar6 + lVar8 + 8) = local_228;
            }
            lVar16 = auVar18._8_8_;
            auVar18._0_8_ = auVar18._0_8_ + 2;
            auVar18._8_8_ = lVar16 + 2;
            lVar8 = lVar8 + 0x10;
          } while ((ulong)(uVar1 + 1 >> 1) << 4 != lVar8);
        }
      }
LAB_013efc61:
      uVar10 = 0;
    }
LAB_013efc63:
    pFVar11->val_ = (double)local_188 * 0.0;
    pFVar11 = local_2d0->fStore;
    uVar1 = pFVar11[1].dx_.num_elts;
    if (uVar10 == uVar1) {
      if (uVar10 != 0) {
        pdVar6 = pFVar11[1].dx_.ptr_to_data;
LAB_013efcd0:
        if (0 < (int)uVar10) {
          uVar12 = 0;
          do {
            pdVar6[uVar12] = *(double *)(local_208 + uVar12 * 8) * 0.0;
            uVar12 = uVar12 + 1;
          } while (uVar10 != uVar12);
        }
      }
    }
    else {
      if (uVar10 != 0) {
        if (uVar1 != 0) {
          pdVar6 = pFVar11[1].dx_.ptr_to_data;
          if (pdVar6 != (double *)0x0) {
            operator_delete__(pdVar6);
          }
          pFVar11[1].dx_.ptr_to_data = (double *)0x0;
        }
        pFVar11[1].dx_.num_elts = uVar10;
        uVar12 = 0xffffffffffffffff;
        if (-1 < (int)uVar10) {
          uVar12 = (ulong)uVar10 << 3;
        }
        pdVar6 = (double *)operator_new__(uVar12);
        pFVar11[1].dx_.ptr_to_data = pdVar6;
        goto LAB_013efcd0;
      }
      if (uVar1 != 0) {
        pdVar6 = pFVar11[1].dx_.ptr_to_data;
        if (pdVar6 != (double *)0x0) {
          operator_delete__(pdVar6);
        }
        pFVar11[1].dx_.num_elts = 0;
        pFVar11[1].dx_.ptr_to_data = (double *)0x0;
      }
    }
    pFVar11[1].val_ = (double)local_218._0_8_ * 0.0;
    break;
  case ESinCos3D:
    FadFuncSin<Fad<double>_>::FadFuncSin
              ((FadFuncSin<Fad<double>_> *)auStack_2f8,(Fad<double> *)local_218);
    FadExpr<FadFuncSin<Fad<double>_>_>::FadExpr
              ((FadExpr<FadFuncSin<Fad<double>_>_> *)local_278,
               (FadFuncSin<Fad<double>_> *)auStack_2f8);
    Fad<double>::~Fad((Fad<double> *)auStack_2f8);
    local_250._0_8_ = (FadExpr<FadFuncSin<Fad<double>_>_> *)local_278;
    FadFuncSin<Fad<double>_>::FadFuncSin((FadFuncSin<Fad<double>_> *)local_2c8,&local_1f8);
    pTVar4 = local_2d0;
    FadExpr<FadFuncSin<Fad<double>_>_>::FadExpr
              ((FadExpr<FadFuncSin<Fad<double>_>_> *)auStack_2f8,
               (FadFuncSin<Fad<double>_> *)local_2c8);
    Fad<double>::~Fad((Fad<double> *)local_2c8);
    local_2a0._0_8_ = local_250;
    local_2a0._8_8_ = (FadExpr<FadFuncSin<Fad<double>_>_> *)auStack_2f8;
    Fad<double>::operator=
              (pTVar4->fStore,
               (FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadFuncSin<Fad<double>_>_>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>
                *)local_2a0);
    Fad<double>::~Fad((Fad<double> *)(auStack_2f8 + 8));
    Fad<double>::~Fad((Fad<double> *)(local_278 + 8));
    FadFuncCos<Fad<double>_>::FadFuncCos
              ((FadFuncCos<Fad<double>_> *)auStack_2f8,(Fad<double> *)local_218);
    FadExpr<FadFuncCos<Fad<double>_>_>::FadExpr
              ((FadExpr<FadFuncCos<Fad<double>_>_> *)local_278,
               (FadFuncCos<Fad<double>_> *)auStack_2f8);
    Fad<double>::~Fad((Fad<double> *)auStack_2f8);
    local_170._0_8_ = (Fad<double> *)local_278;
    FadFuncCos<Fad<double>_>::FadFuncCos((FadFuncCos<Fad<double>_> *)local_2c8,&local_1f8);
    FadExpr<FadFuncCos<Fad<double>_>_>::FadExpr
              ((FadExpr<FadFuncCos<Fad<double>_>_> *)auStack_2f8,
               (FadFuncCos<Fad<double>_> *)local_2c8);
    Fad<double>::~Fad((Fad<double> *)local_2c8);
    local_1b0._0_8_ = local_170;
    local_1b0._8_8_ = (Fad<double> *)auStack_2f8;
    FadFuncSin<Fad<double>_>::FadFuncSin((FadFuncSin<Fad<double>_> *)local_2a0,&local_1f8);
    FadExpr<FadFuncSin<Fad<double>_>_>::FadExpr
              ((FadExpr<FadFuncSin<Fad<double>_>_> *)local_2c8,(FadFuncSin<Fad<double>_> *)local_2a0
              );
    Fad<double>::~Fad((Fad<double> *)local_2a0);
    FadFuncSin<Fad<double>_>::FadFuncSin
              ((FadFuncSin<Fad<double>_> *)local_250,(Fad<double> *)(local_170 + 0x20));
    FadExpr<FadFuncSin<Fad<double>_>_>::FadExpr
              ((FadExpr<FadFuncSin<Fad<double>_>_> *)local_2a0,(FadFuncSin<Fad<double>_> *)local_250
              );
    Fad<double>::~Fad((Fad<double> *)local_250);
    local_1d8._8_8_ = &local_130;
    local_1d8._0_8_ = local_1b0;
    local_130._0_8_ = (Fad<double> *)local_2c8;
    local_130.fadexpr_.expr_.val_ = (double)local_2a0;
    Fad<double>::operator=
              (pTVar4->fStore + 1,
               (FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadFuncSin<Fad<double>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>_>_>
                *)local_1d8);
    Fad<double>::~Fad((Fad<double> *)(local_2a0 + 8));
    Fad<double>::~Fad((Fad<double> *)(local_2c8 + 8));
    Fad<double>::~Fad((Fad<double> *)(auStack_2f8 + 8));
    Fad<double>::~Fad((Fad<double> *)(local_278 + 8));
    FadFuncCos<Fad<double>_>::FadFuncCos((FadFuncCos<Fad<double>_> *)auStack_2f8,&local_1f8);
    FadExpr<FadFuncCos<Fad<double>_>_>::FadExpr
              ((FadExpr<FadFuncCos<Fad<double>_>_> *)local_278,
               (FadFuncCos<Fad<double>_> *)auStack_2f8);
    Fad<double>::~Fad((Fad<double> *)auStack_2f8);
    local_250._0_8_ = (FadExpr<FadFuncCos<Fad<double>_>_> *)local_278;
    FadFuncCos<Fad<double>_>::FadFuncCos
              ((FadFuncCos<Fad<double>_> *)local_2c8,(Fad<double> *)(local_170 + 0x20));
    FadExpr<FadFuncCos<Fad<double>_>_>::FadExpr
              ((FadExpr<FadFuncCos<Fad<double>_>_> *)auStack_2f8,
               (FadFuncCos<Fad<double>_> *)local_2c8);
    Fad<double>::~Fad((Fad<double> *)local_2c8);
    local_2a0._0_8_ = (Fad<double> *)local_250;
    local_2a0._8_8_ = (FadExpr<FadFuncSin<Fad<double>_>_> *)auStack_2f8;
    Fad<double>::operator=
              (pTVar4->fStore + 2,
               (FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>
                *)local_2a0);
    goto LAB_013ef573;
  case EPconst:
    pFVar11 = local_2d0->fStore;
    pFVar11->val_ = (double)local_188;
    Vector<double>::operator=(&pFVar11->dx_,(Vector<double> *)(local_218 + 8));
    iVar5 = local_1f8.dx_.num_elts;
    pFVar11->defaultVal = (double)local_200;
    pFVar11 = pTVar4->fStore;
    uVar12 = (ulong)(uint)local_1f8.dx_.num_elts;
    uVar1 = pFVar11[1].dx_.num_elts;
    if (local_1f8.dx_.num_elts == uVar1) {
      if (local_1f8.dx_.num_elts != 0) {
        pdVar6 = pFVar11[1].dx_.ptr_to_data;
LAB_013efb07:
        if (0 < iVar5) {
          uVar7 = 0;
          do {
            pdVar6[uVar7] = -*(double *)((long)local_1f8.dx_.ptr_to_data + uVar7 * 8);
            uVar7 = uVar7 + 1;
          } while (uVar12 != uVar7);
        }
      }
    }
    else if (local_1f8.dx_.num_elts == 0) {
      if (uVar1 != 0) {
        pdVar6 = pFVar11[1].dx_.ptr_to_data;
        if (pdVar6 != (double *)0x0) {
          operator_delete__(pdVar6);
        }
        pFVar11[1].dx_.num_elts = 0;
        pFVar11[1].dx_.ptr_to_data = (double *)0x0;
      }
    }
    else {
      if (uVar1 != 0) {
        pdVar6 = pFVar11[1].dx_.ptr_to_data;
        if (pdVar6 != (double *)0x0) {
          operator_delete__(pdVar6);
        }
        pFVar11[1].dx_.ptr_to_data = (double *)0x0;
      }
      pFVar11[1].dx_.num_elts = iVar5;
      uVar7 = 0xffffffffffffffff;
      if (-1 < iVar5) {
        uVar7 = uVar12 * 8;
      }
      pdVar6 = (double *)operator_new__(uVar7);
      pFVar11[1].dx_.ptr_to_data = pdVar6;
      auVar3 = _DAT_014d28c0;
      if (local_1f8.dx_.num_elts != 0) goto LAB_013efb07;
      if (0 < iVar5) {
        uVar7 = (ulong)local_1f8.defaultVal ^ (ulong)DAT_014d2310;
        lVar8 = uVar12 - 1;
        auVar15._8_4_ = (int)lVar8;
        auVar15._0_8_ = lVar8;
        auVar15._12_4_ = (int)((ulong)lVar8 >> 0x20);
        lVar8 = 0;
        auVar15 = auVar15 ^ _DAT_014d28c0;
        auVar17 = _DAT_014d28b0;
        do {
          auVar18 = auVar17 ^ auVar3;
          if ((bool)(~(auVar18._4_4_ == auVar15._4_4_ && auVar15._0_4_ < auVar18._0_4_ ||
                      auVar15._4_4_ < auVar18._4_4_) & 1)) {
            *(ulong *)((long)pdVar6 + lVar8) = uVar7;
          }
          if ((auVar18._12_4_ != auVar15._12_4_ || auVar18._8_4_ <= auVar15._8_4_) &&
              auVar18._12_4_ <= auVar15._12_4_) {
            *(ulong *)((long)pdVar6 + lVar8 + 8) = uVar7;
          }
          lVar16 = auVar17._8_8_;
          auVar17._0_8_ = auVar17._0_8_ + 2;
          auVar17._8_8_ = lVar16 + 2;
          lVar8 = lVar8 + 0x10;
        } while ((ulong)(iVar5 + 1U >> 1) << 4 != lVar8);
      }
    }
    pFVar11[1].val_ = -local_1f8.val_;
    break;
  default:
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZAnalyticSolution.cpp"
               ,0x8c0);
  case ESinCosBDS:
    local_228 = (Fad<double> *)exp(this->fcBrinkman / this->fvisco);
    FadFuncSin<Fad<double>_>::FadFuncSin
              ((FadFuncSin<Fad<double>_> *)auStack_2f8,(Fad<double> *)local_218);
    FadExpr<FadFuncSin<Fad<double>_>_>::FadExpr
              ((FadExpr<FadFuncSin<Fad<double>_>_> *)local_278,
               (FadFuncSin<Fad<double>_> *)auStack_2f8);
    local_188 = (Fad<double> *)(1.0 / (double)local_228);
    uStack_180 = 0;
    local_228 = (Fad<double> *)-(double)local_188;
    uStack_220 = 0x8000000000000000;
    Fad<double>::~Fad((Fad<double> *)auStack_2f8);
    local_1d8._8_8_ = local_228;
    local_1d8._16_8_ = (double *)0x0;
    local_1c0 = (FadExpr<FadFuncSin<Fad<double>_>_> *)local_278;
    FadFuncSin<Fad<double>_>::FadFuncSin((FadFuncSin<Fad<double>_> *)local_2c8,&local_1f8);
    FadExpr<FadFuncSin<Fad<double>_>_>::FadExpr
              ((FadExpr<FadFuncSin<Fad<double>_>_> *)auStack_2f8,
               (FadFuncSin<Fad<double>_> *)local_2c8);
    Fad<double>::~Fad((Fad<double> *)local_2c8);
    local_170._0_8_ = (Fad<double> *)local_1d8;
    local_170._8_8_ = auStack_2f8;
    FadFuncSin<Fad<double>_>::FadFuncSin
              ((FadFuncSin<Fad<double>_> *)local_2a0,(Fad<double> *)local_218);
    FadExpr<FadFuncSin<Fad<double>_>_>::FadExpr
              ((FadExpr<FadFuncSin<Fad<double>_>_> *)local_2c8,(FadFuncSin<Fad<double>_> *)local_2a0
              );
    local_188 = (Fad<double> *)(1.0 - (double)local_188);
    Fad<double>::~Fad((Fad<double> *)local_2a0);
    local_1b0._8_8_ = local_188;
    local_1b0._16_8_ = (double *)0x0;
    local_198 = (FadExpr<FadFuncSin<Fad<double>_>_> *)local_2c8;
    FadFuncSin<Fad<double>_>::FadFuncSin((FadFuncSin<Fad<double>_> *)local_250,&local_1f8);
    FadExpr<FadFuncSin<Fad<double>_>_>::FadExpr
              ((FadExpr<FadFuncSin<Fad<double>_>_> *)local_2a0,(FadFuncSin<Fad<double>_> *)local_250
              );
    Fad<double>::~Fad((Fad<double> *)local_250);
    local_130._0_8_ = (Fad<double> *)local_170;
    local_130.fadexpr_.expr_.val_ = (double)&local_f0;
    local_f0 = (FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadFuncSin<Fad<double>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>_>_>_>_>
                *)local_1b0;
    local_e8 = (Fad<double> *)local_2a0;
    Fad<double>::operator=
              (local_2d0->fStore,
               (FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>_>_>
                *)&local_130);
    Fad<double>::~Fad((Fad<double> *)(local_2a0 + 8));
    Fad<double>::~Fad((Fad<double> *)(local_2c8 + 8));
    Fad<double>::~Fad((Fad<double> *)(auStack_2f8 + 8));
    Fad<double>::~Fad((Fad<double> *)(local_278 + 8));
    FadFuncCos<Fad<double>_>::FadFuncCos
              ((FadFuncCos<Fad<double>_> *)auStack_2f8,(Fad<double> *)local_218);
    FadExpr<FadFuncCos<Fad<double>_>_>::FadExpr
              ((FadExpr<FadFuncCos<Fad<double>_>_> *)local_278,
               (FadFuncCos<Fad<double>_> *)auStack_2f8);
    Fad<double>::~Fad((Fad<double> *)auStack_2f8);
    local_1d8._8_8_ = local_228;
    local_1d8._16_8_ = (double *)0x0;
    local_1c0 = (FadExpr<FadFuncSin<Fad<double>_>_> *)local_278;
    FadFuncCos<Fad<double>_>::FadFuncCos((FadFuncCos<Fad<double>_> *)local_2c8,&local_1f8);
    FadExpr<FadFuncCos<Fad<double>_>_>::FadExpr
              ((FadExpr<FadFuncCos<Fad<double>_>_> *)auStack_2f8,
               (FadFuncCos<Fad<double>_> *)local_2c8);
    Fad<double>::~Fad((Fad<double> *)local_2c8);
    local_170._0_8_ = (Fad<double> *)local_1d8;
    local_170._8_8_ = auStack_2f8;
    FadFuncCos<Fad<double>_>::FadFuncCos
              ((FadFuncCos<Fad<double>_> *)local_2a0,(Fad<double> *)local_218);
    FadExpr<FadFuncCos<Fad<double>_>_>::FadExpr
              ((FadExpr<FadFuncCos<Fad<double>_>_> *)local_2c8,(FadFuncCos<Fad<double>_> *)local_2a0
              );
    Fad<double>::~Fad((Fad<double> *)local_2a0);
    local_1b0._8_8_ = local_188;
    local_1b0._16_8_ = (double *)0x0;
    local_198 = (FadExpr<FadFuncSin<Fad<double>_>_> *)local_2c8;
    FadFuncCos<Fad<double>_>::FadFuncCos((FadFuncCos<Fad<double>_> *)local_250,&local_1f8);
    FadExpr<FadFuncCos<Fad<double>_>_>::FadExpr
              ((FadExpr<FadFuncCos<Fad<double>_>_> *)local_2a0,(FadFuncCos<Fad<double>_> *)local_250
              );
    Fad<double>::~Fad((Fad<double> *)local_250);
    local_130._0_8_ = (Fad<double> *)local_170;
    local_130.fadexpr_.expr_.val_ = (double)&local_f0;
    local_f0 = (FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadFuncSin<Fad<double>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>_>_>_>_>
                *)local_1b0;
    local_e8 = (Fad<double> *)local_2a0;
    Fad<double>::operator=
              (local_2d0->fStore + 1,
               (FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>_>_>
                *)&local_130);
    goto LAB_013ef3fd;
  case ESinCosBDS3D:
    local_228 = (Fad<double> *)exp(this->fcBrinkman / this->fvisco);
    FadFuncSin<Fad<double>_>::FadFuncSin
              ((FadFuncSin<Fad<double>_> *)auStack_2f8,(Fad<double> *)local_218);
    FadExpr<FadFuncSin<Fad<double>_>_>::FadExpr
              ((FadExpr<FadFuncSin<Fad<double>_>_> *)local_278,
               (FadFuncSin<Fad<double>_> *)auStack_2f8);
    local_188 = (Fad<double> *)(1.0 / (double)local_228);
    uStack_180 = 0;
    local_108 = (Fad<double> *)-(double)local_188;
    uStack_100 = 0x8000000000000000;
    Fad<double>::~Fad((Fad<double> *)auStack_2f8);
    local_1d8._8_8_ = local_108;
    local_1d8._16_8_ = (double *)0x0;
    local_1c0 = (FadExpr<FadFuncSin<Fad<double>_>_> *)local_278;
    FadFuncSin<Fad<double>_>::FadFuncSin((FadFuncSin<Fad<double>_> *)local_2c8,&local_1f8);
    FadExpr<FadFuncSin<Fad<double>_>_>::FadExpr
              ((FadExpr<FadFuncSin<Fad<double>_>_> *)auStack_2f8,
               (FadFuncSin<Fad<double>_> *)local_2c8);
    pTVar4 = local_2d0;
    Fad<double>::~Fad((Fad<double> *)local_2c8);
    local_170._0_8_ = local_1d8;
    local_170._8_8_ = auStack_2f8;
    FadFuncSin<Fad<double>_>::FadFuncSin
              ((FadFuncSin<Fad<double>_> *)local_2a0,(Fad<double> *)local_218);
    FadExpr<FadFuncSin<Fad<double>_>_>::FadExpr
              ((FadExpr<FadFuncSin<Fad<double>_>_> *)local_2c8,(FadFuncSin<Fad<double>_> *)local_2a0
              );
    local_228 = (Fad<double> *)(1.0 - (double)local_188);
    Fad<double>::~Fad((Fad<double> *)local_2a0);
    local_1b0._8_8_ = local_228;
    local_1b0._16_8_ = (double *)0x0;
    local_198 = (FadExpr<FadFuncSin<Fad<double>_>_> *)local_2c8;
    FadFuncSin<Fad<double>_>::FadFuncSin((FadFuncSin<Fad<double>_> *)local_250,&local_1f8);
    FadExpr<FadFuncSin<Fad<double>_>_>::FadExpr
              ((FadExpr<FadFuncSin<Fad<double>_>_> *)local_2a0,(FadFuncSin<Fad<double>_> *)local_250
              );
    Fad<double>::~Fad((Fad<double> *)local_250);
    local_f0 = (FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadFuncSin<Fad<double>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>_>_>_>_>
                *)local_1b0;
    local_130._0_8_ = local_170;
    local_130.fadexpr_.expr_.val_ = (double)&local_f0;
    local_e8 = (Fad<double> *)local_2a0;
    Fad<double>::operator=
              (pTVar4->fStore,
               (FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>_>_>
                *)&local_130);
    Fad<double>::~Fad((Fad<double> *)(local_2a0 + 8));
    Fad<double>::~Fad((Fad<double> *)(local_2c8 + 8));
    Fad<double>::~Fad((Fad<double> *)(auStack_2f8 + 8));
    Fad<double>::~Fad((Fad<double> *)(local_278 + 8));
    FadFuncCos<Fad<double>_>::FadFuncCos
              ((FadFuncCos<Fad<double>_> *)auStack_2f8,(Fad<double> *)local_218);
    FadExpr<FadFuncCos<Fad<double>_>_>::FadExpr
              ((FadExpr<FadFuncCos<Fad<double>_>_> *)local_278,
               (FadFuncCos<Fad<double>_> *)auStack_2f8);
    Fad<double>::~Fad((Fad<double> *)auStack_2f8);
    local_c8 = (FadExpr<FadFuncCos<Fad<double>_>_> *)local_278;
    FadFuncCos<Fad<double>_>::FadFuncCos((FadFuncCos<Fad<double>_> *)local_2c8,&local_1f8);
    FadExpr<FadFuncCos<Fad<double>_>_>::FadExpr
              ((FadExpr<FadFuncCos<Fad<double>_>_> *)auStack_2f8,
               (FadFuncCos<Fad<double>_> *)local_2c8);
    Fad<double>::~Fad((Fad<double> *)local_2c8);
    local_b0 = &local_c8;
    local_a8 = auStack_2f8;
    FadFuncSin<Fad<double>_>::FadFuncSin((FadFuncSin<Fad<double>_> *)local_2a0,&local_1f8);
    FadExpr<FadFuncSin<Fad<double>_>_>::FadExpr
              ((FadExpr<FadFuncSin<Fad<double>_>_> *)local_2c8,(FadFuncSin<Fad<double>_> *)local_2a0
              );
    Fad<double>::~Fad((Fad<double> *)local_2a0);
    FadFuncSin<Fad<double>_>::FadFuncSin
              ((FadFuncSin<Fad<double>_> *)local_250,(Fad<double> *)(local_170 + 0x20));
    FadExpr<FadFuncSin<Fad<double>_>_>::FadExpr
              ((FadExpr<FadFuncSin<Fad<double>_>_> *)local_2a0,(FadFuncSin<Fad<double>_> *)local_250
              );
    Fad<double>::~Fad((Fad<double> *)local_250);
    local_48 = &local_60;
    local_50 = &local_b0;
    local_e0.ptr_to_data = (double *)&local_50;
    local_e8 = local_188;
    local_e0.num_elts = 0;
    local_e0._4_4_ = 0;
    local_60 = (FadExpr<FadFuncSin<Fad<double>_>_> *)local_2c8;
    local_58 = (FadExpr<FadFuncSin<Fad<double>_>_> *)local_2a0;
    FadFuncCos<Fad<double>_>::FadFuncCos
              ((FadFuncCos<Fad<double>_> *)local_1d8,(Fad<double> *)local_218);
    FadExpr<FadFuncCos<Fad<double>_>_>::FadExpr
              ((FadExpr<FadFuncCos<Fad<double>_>_> *)local_250,(FadFuncCos<Fad<double>_> *)local_1d8
              );
    Fad<double>::~Fad((Fad<double> *)local_1d8);
    local_d0 = (FadExpr<FadFuncCos<Fad<double>_>_> *)local_250;
    FadFuncCos<Fad<double>_>::FadFuncCos((FadFuncCos<Fad<double>_> *)local_1b0,&local_1f8);
    FadExpr<FadFuncCos<Fad<double>_>_>::FadExpr
              ((FadExpr<FadFuncCos<Fad<double>_>_> *)local_1d8,(FadFuncCos<Fad<double>_> *)local_1b0
              );
    Fad<double>::~Fad((Fad<double> *)local_1b0);
    local_c0 = &local_d0;
    local_b8 = (Fad<double> *)local_1d8;
    FadFuncSin<Fad<double>_>::FadFuncSin((FadFuncSin<Fad<double>_> *)&local_130,&local_1f8);
    FadExpr<FadFuncSin<Fad<double>_>_>::FadExpr
              ((FadExpr<FadFuncSin<Fad<double>_>_> *)local_1b0,
               (FadFuncSin<Fad<double>_> *)&local_130);
    Fad<double>::~Fad((Fad<double> *)&local_130);
    FadFuncSin<Fad<double>_>::FadFuncSin
              ((FadFuncSin<Fad<double>_> *)local_170,(Fad<double> *)(local_170 + 0x20));
    FadExpr<FadFuncSin<Fad<double>_>_>::FadExpr(&local_130,(FadFuncSin<Fad<double>_> *)local_170);
    Fad<double>::~Fad((Fad<double> *)local_170);
    local_88 = &local_a0;
    local_90 = &local_c0;
    local_68 = &local_90;
    local_78 = local_228;
    local_70 = 0;
    local_a0 = (FadExpr<FadFuncSin<Fad<double>_>_> *)local_1b0;
    local_98 = &local_130;
    local_40.fadexpr_.left_ =
         (FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadFuncSin<Fad<double>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>_>_>_>_>
          *)&local_f0;
    local_40.fadexpr_.right_ =
         (FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadFuncSin<Fad<double>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>_>_>_>_>
          *)&local_80;
    Fad<double>::operator=(local_2d0->fStore + 1,&local_40);
    Fad<double>::~Fad(&local_130.fadexpr_.expr_);
    Fad<double>::~Fad((Fad<double> *)(local_1b0 + 8));
    Fad<double>::~Fad((Fad<double> *)(local_1d8 + 8));
    Fad<double>::~Fad((Fad<double> *)(local_250 + 8));
    Fad<double>::~Fad((Fad<double> *)(local_2a0 + 8));
    Fad<double>::~Fad((Fad<double> *)(local_2c8 + 8));
    Fad<double>::~Fad((Fad<double> *)(auStack_2f8 + 8));
    Fad<double>::~Fad((Fad<double> *)(local_278 + 8));
    FadFuncCos<Fad<double>_>::FadFuncCos((FadFuncCos<Fad<double>_> *)auStack_2f8,&local_1f8);
    FadExpr<FadFuncCos<Fad<double>_>_>::FadExpr
              ((FadExpr<FadFuncCos<Fad<double>_>_> *)local_278,
               (FadFuncCos<Fad<double>_> *)auStack_2f8);
    Fad<double>::~Fad((Fad<double> *)auStack_2f8);
    local_1d8._8_8_ = local_108;
    local_1d8._16_8_ = (double *)0x0;
    local_1c0 = (FadExpr<FadFuncSin<Fad<double>_>_> *)local_278;
    FadFuncCos<Fad<double>_>::FadFuncCos
              ((FadFuncCos<Fad<double>_> *)local_2c8,(Fad<double> *)(local_170 + 0x20));
    FadExpr<FadFuncCos<Fad<double>_>_>::FadExpr
              ((FadExpr<FadFuncCos<Fad<double>_>_> *)auStack_2f8,
               (FadFuncCos<Fad<double>_> *)local_2c8);
    Fad<double>::~Fad((Fad<double> *)local_2c8);
    local_170._0_8_ = (Fad<double> *)local_1d8;
    local_170._8_8_ = auStack_2f8;
    FadFuncCos<Fad<double>_>::FadFuncCos((FadFuncCos<Fad<double>_> *)local_2a0,&local_1f8);
    FadExpr<FadFuncCos<Fad<double>_>_>::FadExpr
              ((FadExpr<FadFuncCos<Fad<double>_>_> *)local_2c8,(FadFuncCos<Fad<double>_> *)local_2a0
              );
    Fad<double>::~Fad((Fad<double> *)local_2a0);
    local_80 = (FadExpr<FadFuncCos<Fad<double>_>_> *)local_2c8;
    FadFuncCos<Fad<double>_>::FadFuncCos
              ((FadFuncCos<Fad<double>_> *)local_250,(Fad<double> *)(local_170 + 0x20));
    FadExpr<FadFuncCos<Fad<double>_>_>::FadExpr
              ((FadExpr<FadFuncCos<Fad<double>_>_> *)local_2a0,(FadFuncCos<Fad<double>_> *)local_250
              );
    Fad<double>::~Fad((Fad<double> *)local_250);
    local_1b0._8_8_ = local_228;
    local_1b0._16_8_ = (double *)0x0;
    local_198 = (FadExpr<FadFuncSin<Fad<double>_>_> *)&local_f0;
    local_130._0_8_ = (Fad<double> *)local_170;
    local_130.fadexpr_.expr_.val_ = (double)local_1b0;
    local_f0 = (FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadFuncSin<Fad<double>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>_>_>_>_>
                *)&local_80;
    local_e8 = (Fad<double> *)local_2a0;
    Fad<double>::operator=
              (local_2d0->fStore + 2,
               (FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>_>_>_>_>
                *)&local_130);
LAB_013ef3fd:
    Fad<double>::~Fad((Fad<double> *)(local_2a0 + 8));
    Fad<double>::~Fad((Fad<double> *)(local_2c8 + 8));
LAB_013ef573:
    Fad<double>::~Fad((Fad<double> *)(auStack_2f8 + 8));
    puVar2 = local_278;
LAB_013ef585:
    Fad<double>::~Fad((Fad<double> *)(puVar2 + 8));
    break;
  case EGatica3D:
    local_2e8 = (Fad<double> *)this->Pi;
    pdStack_260 = (double *)0x0;
    local_258 = (Fad<double> *)local_218;
    pFStack_2e0 = (Fad<double> *)0x0;
    local_2d8 = &local_1f8;
    pFStack_2b0 = (FadExpr<FadFuncCos<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_> *)0x0
    ;
    local_2a8 = (Fad<double> *)(local_170 + 0x20);
    pFStack_2b8 = local_2e8;
    local_2a0._0_8_ = (Fad<double> *)local_250;
    local_2a0._8_8_ = (Fad<double> *)local_2c8;
    local_268 = local_2e8;
    local_250._0_8_ =
         (FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_> *)local_278;
    local_250._8_8_ = (FadExpr<FadFuncSin<Fad<double>_>_> *)auStack_2f8;
    Fad<double>::operator=
              (local_2d0->fStore,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadFuncCos<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>
                *)local_2a0);
    local_2e8 = (Fad<double> *)this->Pi;
    pdStack_260 = (double *)0x0;
    local_258 = (Fad<double> *)local_218;
    pFStack_2e0 = (Fad<double> *)0x0;
    local_2d8 = &local_1f8;
    pFStack_2b0 = (FadExpr<FadFuncCos<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_> *)0x0
    ;
    local_2a8 = (Fad<double> *)(local_170 + 0x20);
    pFStack_2b8 = local_2e8;
    local_2a0._0_8_ = (Fad<double> *)local_250;
    local_2a0._8_8_ = (Fad<double> *)local_2c8;
    local_268 = local_2e8;
    local_250._0_8_ =
         (FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_> *)local_278;
    local_250._8_8_ = (FadExpr<FadFuncSin<Fad<double>_>_> *)auStack_2f8;
    Fad<double>::operator=
              (pTVar4->fStore + 1,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>
                *)local_2a0);
    local_2e8 = (Fad<double> *)this->Pi;
    pdStack_260 = (double *)0x0;
    local_258 = (Fad<double> *)local_218;
    local_2a0._8_8_ = (FadExpr<FadFuncSin<Fad<double>_>_> *)0xc000000000000000;
    local_2a0._16_8_ = (double *)0x0;
    pFStack_288 = (Fad<double> *)local_278;
    pFStack_2e0 = (Fad<double> *)0x0;
    local_2d8 = &local_1f8;
    local_250._0_8_ = local_1d8;
    pFStack_2b0 = (FadExpr<FadFuncCos<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_> *)0x0
    ;
    local_2a8 = (Fad<double> *)(local_170 + 0x20);
    pFStack_2b8 = local_2e8;
    local_268 = local_2e8;
    local_250._8_8_ = (Fad<double> *)local_2c8;
    local_1d8._0_8_ = (FadExpr<FadFuncSin<Fad<double>_>_> *)local_2a0;
    local_1d8._8_8_ = (Fad<double> *)auStack_2f8;
    Fad<double>::operator=
              (pTVar4->fStore + 2,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>
                *)local_250);
    break;
  case ECouplingSD:
    if ((double)local_108 < 0.0) {
      local_1d8._8_8_ = &local_1f8;
      FadFuncExp<Fad<double>_>::FadFuncExp((FadFuncExp<Fad<double>_> *)auStack_2f8,&local_1f8);
      FadExpr<FadFuncExp<Fad<double>_>_>::FadExpr
                ((FadExpr<FadFuncExp<Fad<double>_>_> *)local_278,
                 (FadFuncExp<Fad<double>_> *)auStack_2f8);
      Fad<double>::~Fad((Fad<double> *)auStack_2f8);
      local_250._0_8_ = (FadExpr<FadFuncCos<Fad<double>_>_> *)local_1d8;
      local_250._8_8_ = (FadExpr<FadFuncExp<Fad<double>_>_> *)local_278;
      FadFuncCos<Fad<double>_>::FadFuncCos
                ((FadFuncCos<Fad<double>_> *)local_2c8,(Fad<double> *)local_218);
      pTVar4 = local_2d0;
      FadExpr<FadFuncCos<Fad<double>_>_>::FadExpr
                ((FadExpr<FadFuncCos<Fad<double>_>_> *)auStack_2f8,
                 (FadFuncCos<Fad<double>_> *)local_2c8);
      Fad<double>::~Fad((Fad<double> *)local_2c8);
      local_2a0._0_8_ = (FadExpr<FadFuncSin<Fad<double>_>_> *)local_250;
      local_2a0._8_8_ = (FadExpr<FadFuncSin<Fad<double>_>_> *)auStack_2f8;
      Fad<double>::operator=
                (pTVar4->fStore,
                 (FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadFuncExp<FadExpr<FadUnaryMin<Fad<double>_>_>_>_>,_FadExpr<FadFuncExp<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>
                  *)local_2a0);
      Fad<double>::~Fad((Fad<double> *)(auStack_2f8 + 8));
      Fad<double>::~Fad((Fad<double> *)(local_278 + 8));
      local_1d8._8_8_ = &local_1f8;
      FadFuncExp<Fad<double>_>::FadFuncExp((FadFuncExp<Fad<double>_> *)auStack_2f8,&local_1f8);
      FadExpr<FadFuncExp<Fad<double>_>_>::FadExpr
                ((FadExpr<FadFuncExp<Fad<double>_>_> *)local_278,
                 (FadFuncExp<Fad<double>_> *)auStack_2f8);
      Fad<double>::~Fad((Fad<double> *)auStack_2f8);
      local_250._0_8_ = (FadExpr<FadFuncCos<Fad<double>_>_> *)local_1d8;
      local_250._8_8_ = (Fad<double> *)local_278;
      local_1b0._0_8_ = (FadExpr<FadFuncSin<Fad<double>_>_> *)local_250;
      FadFuncSin<Fad<double>_>::FadFuncSin
                ((FadFuncSin<Fad<double>_> *)local_2c8,(Fad<double> *)local_218);
      FadExpr<FadFuncSin<Fad<double>_>_>::FadExpr
                ((FadExpr<FadFuncSin<Fad<double>_>_> *)auStack_2f8,
                 (FadFuncSin<Fad<double>_> *)local_2c8);
      Fad<double>::~Fad((Fad<double> *)local_2c8);
      local_2a0._0_8_ = local_1b0;
      local_2a0._8_8_ = (FadExpr<FadFuncSin<Fad<double>_>_> *)auStack_2f8;
      Fad<double>::operator=
                (pTVar4->fStore + 1,
                 (FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadBinaryAdd<FadExpr<FadFuncExp<FadExpr<FadUnaryMin<Fad<double>_>_>_>_>,_FadExpr<FadFuncExp<Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>
                  *)local_2a0);
      goto LAB_013ef573;
    }
    if ((double)local_108 < 0.0) break;
    local_2e8 = (Fad<double> *)this->Pi;
    local_250._8_8_ = 2.0 / (double)local_2e8;
    pdStack_260 = (double *)0x0;
    local_250._16_8_ = (double *)0x0;
    pFStack_2e0 = (Fad<double> *)0x0;
    local_2d8 = &local_1f8;
    local_268 = local_2e8;
    local_258 = &local_1f8;
    pFStack_238 = (Fad<double> *)local_278;
    local_1b0._0_8_ = (Fad<double> *)local_250;
    local_1b0._8_8_ = (FadExpr<FadFuncSin<Fad<double>_>_> *)auStack_2f8;
    FadFuncCos<Fad<double>_>::FadFuncCos
              ((FadFuncCos<Fad<double>_> *)local_2a0,(Fad<double> *)local_218);
    FadExpr<FadFuncCos<Fad<double>_>_>::FadExpr
              ((FadExpr<FadFuncCos<Fad<double>_>_> *)local_2c8,(FadFuncCos<Fad<double>_> *)local_2a0
              );
    Fad<double>::~Fad((Fad<double> *)local_2a0);
    local_1d8._0_8_ = local_1b0;
    local_1d8._8_8_ = (FadExpr<FadFuncCos<Fad<double>_>_> *)local_2c8;
    Fad<double>::operator=
              (local_2d0->fStore,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>
                *)local_1d8);
    Fad<double>::~Fad((Fad<double> *)(local_2c8 + 8));
    local_2e8 = (Fad<double> *)this->Pi;
    local_250._8_8_ = 1.0 / ((double)local_2e8 * (double)local_2e8);
    pdStack_260 = (double *)0x0;
    local_250._16_8_ = (double *)0x0;
    pFStack_2e0 = (Fad<double> *)0x0;
    local_1d8._0_8_ = &local_130;
    local_1d8._8_8_ = (Fad<double> *)0x4000000000000000;
    local_1d8._16_8_ = (double *)0x0;
    local_2d8 = &local_1f8;
    local_268 = local_2e8;
    local_258 = &local_1f8;
    pFStack_238 = (Fad<double> *)local_278;
    local_130._0_8_ = (Fad<double> *)local_250;
    local_130.fadexpr_.expr_.val_ = (double)auStack_2f8;
    FadFuncSin<Fad<double>_>::FadFuncSin
              ((FadFuncSin<Fad<double>_> *)local_2a0,(Fad<double> *)local_218);
    FadExpr<FadFuncSin<Fad<double>_>_>::FadExpr
              ((FadExpr<FadFuncSin<Fad<double>_>_> *)local_2c8,(FadFuncSin<Fad<double>_> *)local_2a0
              );
    pTVar4 = local_2d0;
    Fad<double>::~Fad((Fad<double> *)local_2a0);
    local_1b0._0_8_ = (FadExpr<FadFuncSin<Fad<double>_>_> *)local_1d8;
    local_1b0._8_8_ = (Fad<double> *)local_2c8;
    Fad<double>::operator=
              (pTVar4->fStore + 1,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadCst<double>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>
                *)local_1b0);
    puVar2 = local_2c8;
    goto LAB_013ef585;
  case ECouplingNSD:
    if (1.0 <= (double)local_108) {
      if (1.0 <= (double)local_108) {
        auStack_2f8._8_8_ = this->Pi;
        local_2e8 = (Fad<double> *)0x0;
        pFStack_2e0 = &local_1f8;
        local_130._0_8_ = local_278;
        local_268 = (Fad<double> *)0x4000000000000000;
        pdStack_260 = (double *)0x0;
        local_2a0._16_8_ = (double *)0x0;
        pFStack_2b8 = (Fad<double> *)0x4000000000000000;
        pFStack_2b0 = (FadExpr<FadFuncCos<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_> *
                      )0x0;
        local_1b0._0_8_ = &local_130;
        local_1d8._16_8_ = (double *)0x0;
        local_1c0 = (FadExpr<FadFuncSin<Fad<double>_>_> *)local_218;
        local_250._16_8_ = (double *)0x4000000000000000;
        pFStack_238 = (Fad<double> *)0x0;
        local_2c8._8_8_ = (Fad<double> *)local_2a0;
        local_2a0._8_8_ = auStack_2f8._8_8_;
        pFStack_288 = pFStack_2e0;
        local_278._8_8_ = auStack_2f8;
        local_250._8_8_ = (FadExpr<FadFuncSin<Fad<double>_>_> *)local_1d8;
        local_1d8._8_8_ = auStack_2f8._8_8_;
        local_1b0._8_8_ = (FadExpr<FadFuncSin<Fad<double>_>_> *)local_250;
        local_130.fadexpr_.expr_.val_ = (double)local_2c8;
        Fad<double>::operator=
                  (local_2d0->fStore,
                   (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>_>_>
                    *)local_1b0);
        local_2c8._8_8_ = this->Pi;
        pFStack_2b8 = (Fad<double> *)0x0;
        pFStack_2b0 = (FadExpr<FadFuncCos<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_> *
                      )local_218;
        local_2e8 = (Fad<double> *)0x4000000000000000;
        pFStack_2e0 = (Fad<double> *)0x0;
        local_1b0._0_8_ = local_170;
        pdStack_260 = (double *)0x0;
        local_258 = &local_1f8;
        local_2a0._8_8_ = (FadExpr<FadFuncSin<Fad<double>_>_> *)0x3fd0000000000000;
        local_2a0._16_8_ = (double *)0x0;
        pFStack_288 = (Fad<double> *)local_278;
        local_250._16_8_ = (double *)0x0;
        local_1d8._8_8_ = (Fad<double> *)0x4010000000000000;
        local_1d8._16_8_ = (double *)0x0;
        local_1b0._8_8_ = &local_130;
        auStack_2f8._8_8_ =
             (FadExpr<FadFuncSin<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_> *)
             local_2c8;
        local_268 = (Fad<double> *)local_2c8._8_8_;
        local_250._8_8_ = local_2c8._8_8_;
        pFStack_238 = local_258;
        local_1d8._0_8_ = (FadExpr<FadFuncSin<Fad<double>_>_> *)local_250;
        local_170._0_8_ = (Fad<double> *)auStack_2f8;
        local_130._0_8_ = (Fad<double> *)local_2a0;
        local_130.fadexpr_.expr_.val_ = (double)local_1d8;
        Fad<double>::operator=
                  (local_2d0->fStore + 1,
                   (FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>_>_>
                    *)local_1b0);
      }
    }
    else {
      local_2a0._8_8_ = this->Pi;
      auStack_2f8._8_8_ = (double)local_2a0._8_8_ * -0.125 * (double)local_2a0._8_8_;
      local_2e8 = (Fad<double> *)0x0;
      local_2a0._16_8_ = (double *)0x0;
      pFStack_288 = (Fad<double> *)local_218;
      local_1d8._8_8_ = local_2c8;
      pFStack_2b8 = (Fad<double> *)0x4000000000000000;
      pFStack_2b0 = (FadExpr<FadFuncCos<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_> *)
                    0x0;
      local_250._0_8_ = local_1d8;
      local_268 = (Fad<double> *)0x3ff0000000000000;
      pdStack_260 = (double *)0x0;
      pFStack_2e0 = &local_1f8;
      local_2c8._8_8_ =
           (FadExpr<FadFuncCos<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_> *)local_2a0;
      local_258 = &local_1f8;
      local_250._8_8_ = (FadExpr<FadFuncSin<Fad<double>_>_> *)local_278;
      local_1d8._0_8_ =
           (FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>_>_>
            *)auStack_2f8;
      Fad<double>::operator=
                (local_2d0->fStore,
                 (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_>_>_>
                  *)local_250);
      local_250._8_8_ = this->Pi;
      local_2c8._8_8_ = (double)local_250._8_8_ * 0.25;
      local_250._16_8_ = (double *)0x0;
      pFStack_238 = (Fad<double> *)local_218;
      local_2a0._16_8_ = (double *)0x4000000000000000;
      pFStack_288 = (Fad<double> *)0x0;
      pFStack_2b8 = (Fad<double> *)0x0;
      local_130._0_8_ = local_170;
      local_268 = (Fad<double> *)0x3ff0000000000000;
      pdStack_260 = (double *)0x0;
      local_1b0._0_8_ = &local_130;
      local_2e8 = (Fad<double> *)0x3ff0000000000000;
      pFStack_2e0 = (Fad<double> *)0x0;
      local_1d8._8_8_ = local_1b0;
      local_1d8._0_8_ = local_2c8;
      local_2d8 = &local_1f8;
      pFStack_2b0 = (FadExpr<FadFuncCos<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_> *)
                    local_2a0;
      local_2a0._8_8_ = (FadExpr<FadFuncSin<Fad<double>_>_> *)local_250;
      local_258 = &local_1f8;
      local_1b0._8_8_ = (Fad<double> *)auStack_2f8;
      local_170._0_8_ = &local_1f8;
      local_130.fadexpr_.expr_.val_ = (double)local_278;
      Fad<double>::operator=
                (pTVar4->fStore + 1,
                 (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_>_>_>_>_>
                  *)local_1d8);
    }
  }
  Fad<double>::~Fad((Fad<double> *)(local_170 + 0x20));
  Fad<double>::~Fad(&local_1f8);
  Fad<double>::~Fad((Fad<double> *)local_218);
  return;
}

Assistant:

void TStokesAnalytic::uxy(const TPZVec<TVar> &x, TPZVec<TVar> &flux) const
{
    TVar x1 = x[0];
    TVar x2 = x[1];
    TVar x3 = x[2];
    REAL Re = 0.;
    REAL lambda = 0.;
    REAL xs = 0.; 
    
    switch(fExactSol)
    {
        case ESinCos:
            flux[0] = -1.*sin(x1)*sin(x2);
            flux[1] = -1.*cos(x1)*cos(x2);
            break;
        case ENoFlow:
            flux[0] = x1*0.;
            flux[1] = x1*0.;
            break;
        case ESinCosBDS:
	    if(fvisco==0) xs = 0.;
	    xs = 1./exp(fcBrinkman/fvisco);
            flux[0] = -xs*sin(x1)*sin(x2)+(1.-xs)*sin(x1)*sin(x2);
            flux[1] = -xs*cos(x1)*cos(x2)-(1.-xs)*cos(x1)*cos(x2);
            break;
	case ECouplingSD:
	    if(x2<0.){
		flux[0] = (exp(-x2)-exp(x2))*cos(x1);
		flux[1] = -(exp(-x2)+exp(x2))*sin(x1);			
	    }else if(x2>=0.){
		flux[0] = (2./Pi)*sin(Pi*x2)*cos(Pi*x2)*cos(x1);
		flux[1] = ((1./(Pi*Pi))*sin(Pi*x2)*sin(Pi*x2)-2.)*sin(x1);	
	    }
	    break;
	case ECouplingNSD:
	    if(x2<1.){
		flux[0] = -(1./8.)*Pi*Pi*x2*sin(Pi*x1/2.)*sin(1.-x2);
		flux[1] = (1./4.)*Pi*cos(Pi*x1/2.)*(-x2*cos(1.-x2)+sin(1.-x2));			
	    }else if(x2>=1.){
	        flux[0] = cos(Pi*x2/2.)*cos(Pi*x2/2.)*sin(Pi*x1/2.);
	        flux[1] = -cos(Pi*x1/2.)*((1./4.)*sin(Pi*x2)+Pi*x2/4.);	
	    }
	    break;
	case ESinCosBDS3D:
	    xs = 1./exp(fcBrinkman/fvisco);
            flux[0] = -xs*sin(x1)*sin(x2)+(1.-xs)*sin(x1)*sin(x2);
            flux[1] = xs*(-cos(x1)*cos(x2)-sin(x2)*sin(x3))+(1.-xs)*(-cos(x1)*cos(x2)+sin(x2)*sin(x3));
            flux[2] = -xs*cos(x2)*cos(x3)+(1.-xs)*(-cos(x2)*cos(x3));
            break;
	case EGatica3D:
    	    flux[0] = cos(Pi*x1)*sin(Pi*x2)*sin(Pi*x3);
	    flux[1] = sin(Pi*x1)*cos(Pi*x2)*sin(Pi*x3);
	    flux[2] = -2.*sin(Pi*x1)*sin(Pi*x2)*cos(Pi*x3);
	break;
        case ESinCos3D:
            flux[0] = -sin(x1)*sin(x2);
            flux[1] = -cos(x1)*cos(x2)-sin(x2)*sin(x3);
            flux[2] = -cos(x2)*cos(x3);
            break;
        case EKovasznay:
        case EKovasznayCDG:
	    Re = 1./fvisco; //Reynolds number
            lambda = Re/2.- sqrt(Re*Re/4.+4.*Pi*Pi); // Parameter for Navier-Stokes solution
            flux[0] = 1. - exp(lambda*x1)*cos(2.*Pi*x2);
            flux[1] = (lambda/(2.*Pi))*exp(lambda*x1)*sin(2.*Pi*x2);
            break;
        case EPconst:
            flux[0] = x1;
            flux[1] = -x2;
            break;
        default:
            DebugStop();
    }
}